

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O3

uint8 * rw::ps2::rasterLock(Raster *raster,int32 level,int32 lockMode)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint8 *puVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  int32 iVar9;
  int32 iVar10;
  
  if (0 < level) {
    bVar1 = *(byte *)((long)&raster->pixels + (long)nativeRasterOffset + 4);
    if ((((uint)raster->format >> 0xe & 1) == 0) && ((bVar1 & 2) != 0)) {
      iVar3 = 4;
      iVar2 = 0x10;
    }
    else {
      bVar7 = ((uint)raster->format >> 0xe & 1) != 0;
      bVar8 = (bVar1 & 4) != 0;
      iVar2 = 0x20;
      if (!bVar8 || !bVar7) {
        iVar2 = 8;
      }
      bVar8 = bVar8 && bVar7;
      iVar3 = (uint)bVar8 + (uint)bVar8 * 2 + 1;
    }
    iVar9 = raster->width;
    iVar10 = raster->height;
    puVar4 = raster->pixels;
    do {
      iVar6 = iVar9;
      if (iVar9 <= iVar2) {
        iVar6 = iVar2;
      }
      iVar5 = iVar10;
      if (iVar10 <= iVar3) {
        iVar5 = iVar3;
      }
      iVar5 = iVar6 * raster->depth * iVar5;
      iVar6 = iVar5 + 7;
      if (-1 < iVar5) {
        iVar6 = iVar5;
      }
      puVar4 = puVar4 + (long)(int)((iVar6 >> 3) + 0xfU & 0xfffffff0) + 0x50;
      iVar9 = iVar9 / 2;
      iVar10 = iVar10 / 2;
      level = level + -1;
    } while (level != 0);
    raster->width = iVar9;
    raster->height = iVar10;
    raster->pixels = puVar4;
  }
  if ((lockMode & 4U) == 0) {
    unswizzleRaster(raster);
  }
  if ((lockMode & 2U) != 0) {
    *(byte *)&raster->privateFlags = (byte)raster->privateFlags | 2;
  }
  if ((lockMode & 1U) != 0) {
    *(byte *)&raster->privateFlags = (byte)raster->privateFlags | 4;
  }
  return raster->pixels;
}

Assistant:

uint8*
rasterLock(Raster *raster, int32 level, int32 lockMode)
{
	Ps2Raster *natras = GETPS2RASTEREXT(raster);
	assert(raster->depth != 24);

	if(level > 0){
		int32 minw, minh;
		int32 mipw, miph;
		transferMinSize(raster->format & Raster::PAL4 ? PSMT4 : PSMT8, natras->flags, &minw, &minh);
		while(level--){
			mipw = max(raster->width, minw);
			miph = max(raster->height, minh);
			raster->pixels += ALIGN16(mipw*miph*raster->depth/8) + 0x50;
			raster->width /= 2;
			raster->height /= 2;
		}
	}

	if((lockMode & Raster::LOCKNOFETCH) == 0)
		unswizzleRaster(raster);
	if(lockMode & Raster::LOCKREAD) raster->privateFlags |= Raster::PRIVATELOCK_READ;
	if(lockMode & Raster::LOCKWRITE) raster->privateFlags |= Raster::PRIVATELOCK_WRITE;
	return raster->pixels;
}